

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# var_based_part.c
# Opt level: O0

void fill_variance_8x8avg_lowbd
               (uint8_t *src_buf,int src_stride,uint8_t *dst_buf,int dst_stride,int x16_idx,
               int y16_idx,VP16x16 *vst,int pixels_wide,int pixels_high)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int in_ECX;
  uint8_t *in_RDX;
  int in_ESI;
  uint8_t *in_RDI;
  int in_R8D;
  int in_R9D;
  int idx_2;
  int dst_avg_1;
  int src_avg_1;
  int y8_idx;
  int x8_idx;
  int idx_1;
  int idx;
  int dst_avg [4];
  int src_avg [4];
  int sum [4];
  uint sse [4];
  int local_84;
  uint local_70;
  int local_6c;
  int local_68 [4];
  int local_58 [4];
  int local_48 [4];
  uint32_t local_38 [5];
  int local_24;
  int local_20;
  int local_1c;
  uint8_t *local_18;
  
  local_24 = in_R9D;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_18 = in_RDX;
  memset(local_38,0,0x10);
  memset(local_48,0,0x10);
  iVar1 = all_blks_inside(local_20,local_24,y8_idx,idx_1);
  if (iVar1 == 0) {
    for (local_70 = 0; (int)local_70 < 4; local_70 = local_70 + 1) {
      if (((int)(local_20 + (local_70 & 1) * 8) < y8_idx) &&
         (local_24 + ((int)local_70 >> 1) * 8 < idx_1)) {
        uVar2 = aom_avg_8x8_sse2(in_RDI,in_ESI);
        uVar3 = aom_avg_8x8_sse2(in_RDI,in_ESI);
        local_48[(int)local_70] = uVar2 - uVar3;
        local_38[(int)local_70] = local_48[(int)local_70] * local_48[(int)local_70];
      }
    }
  }
  else {
    (*aom_avg_8x8_quad)(in_RDI,in_ESI,local_20,local_24,local_58);
    (*aom_avg_8x8_quad)(local_18,local_1c,local_20,local_24,local_68);
    for (local_6c = 0; local_6c < 4; local_6c = local_6c + 1) {
      local_48[local_6c] = local_58[local_6c] - local_68[local_6c];
      local_38[local_6c] = local_48[local_6c] * local_48[local_6c];
    }
  }
  for (local_84 = 0; local_84 < 4; local_84 = local_84 + 1) {
    fill_variance(local_38[local_84],local_48[local_84],0,
                  (VPartVar *)(_dst_avg_1 + 0x50 + (long)local_84 * 0x290));
  }
  return;
}

Assistant:

static inline void fill_variance_8x8avg_lowbd(
    const uint8_t *src_buf, int src_stride, const uint8_t *dst_buf,
    int dst_stride, int x16_idx, int y16_idx, VP16x16 *vst, int pixels_wide,
    int pixels_high) {
  unsigned int sse[4] = { 0 };
  int sum[4] = { 0 };

  if (all_blks_inside(x16_idx, y16_idx, pixels_wide, pixels_high)) {
    int src_avg[4];
    int dst_avg[4];
    aom_avg_8x8_quad(src_buf, src_stride, x16_idx, y16_idx, src_avg);
    aom_avg_8x8_quad(dst_buf, dst_stride, x16_idx, y16_idx, dst_avg);
    for (int idx = 0; idx < 4; idx++) {
      sum[idx] = src_avg[idx] - dst_avg[idx];
      sse[idx] = sum[idx] * sum[idx];
    }
  } else {
    for (int idx = 0; idx < 4; idx++) {
      const int x8_idx = x16_idx + GET_BLK_IDX_X(idx, 3);
      const int y8_idx = y16_idx + GET_BLK_IDX_Y(idx, 3);
      if (x8_idx < pixels_wide && y8_idx < pixels_high) {
        int src_avg =
            aom_avg_8x8(src_buf + y8_idx * src_stride + x8_idx, src_stride);
        int dst_avg =
            aom_avg_8x8(dst_buf + y8_idx * dst_stride + x8_idx, dst_stride);
        sum[idx] = src_avg - dst_avg;
        sse[idx] = sum[idx] * sum[idx];
      }
    }
  }

  for (int idx = 0; idx < 4; idx++) {
    fill_variance(sse[idx], sum[idx], 0, &vst->split[idx].part_variances.none);
  }
}